

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  undefined1 local_88 [8];
  ucvector compressed_data;
  size_t textsize;
  size_t i;
  ucvector data;
  uint error;
  char *textstring_local;
  char *transkey_local;
  char *langtag_local;
  char *keyword_local;
  uint compressed_local;
  ucvector *out_local;
  
  data.allocsize._4_4_ = 0;
  compressed_data.allocsize = strlen(textstring);
  ucvector_init((ucvector *)&i);
  for (textsize = 0; keyword[textsize] != '\0'; textsize = textsize + 1) {
    ucvector_push_back((ucvector *)&i,keyword[textsize]);
  }
  if ((textsize == 0) || (0x4f < textsize)) {
    out_local._4_4_ = 0x59;
  }
  else {
    ucvector_push_back((ucvector *)&i,'\0');
    ucvector_push_back((ucvector *)&i,compressed != 0);
    ucvector_push_back((ucvector *)&i,'\0');
    for (textsize = 0; langtag[textsize] != '\0'; textsize = textsize + 1) {
      ucvector_push_back((ucvector *)&i,langtag[textsize]);
    }
    ucvector_push_back((ucvector *)&i,'\0');
    for (textsize = 0; transkey[textsize] != '\0'; textsize = textsize + 1) {
      ucvector_push_back((ucvector *)&i,transkey[textsize]);
    }
    ucvector_push_back((ucvector *)&i,'\0');
    if (compressed == 0) {
      for (textsize = 0; textstring[textsize] != '\0'; textsize = textsize + 1) {
        ucvector_push_back((ucvector *)&i,textstring[textsize]);
      }
    }
    else {
      ucvector_init((ucvector *)local_88);
      data.allocsize._4_4_ =
           zlib_compress((uchar **)local_88,(size_t *)&compressed_data,(uchar *)textstring,
                         compressed_data.allocsize,zlibsettings);
      if (data.allocsize._4_4_ == 0) {
        for (textsize = 0; (uchar *)textsize != compressed_data.data; textsize = textsize + 1) {
          ucvector_push_back((ucvector *)&i,*(uchar *)((long)local_88 + textsize));
        }
      }
      ucvector_cleanup(local_88);
    }
    if (data.allocsize._4_4_ == 0) {
      data.allocsize._4_4_ = addChunk(out,"iTXt",(uchar *)i,(size_t)data.data);
    }
    ucvector_cleanup(&i);
    out_local._4_4_ = data.allocsize._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings)
{
  unsigned error = 0;
  ucvector data;
  size_t i, textsize = strlen(textstring);

  ucvector_init(&data);

  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*null termination char*/
  ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
  ucvector_push_back(&data, 0); /*compression method*/
  for(i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
  ucvector_push_back(&data, 0); /*null termination char*/
  for(i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
  ucvector_push_back(&data, 0); /*null termination char*/

  if(compressed)
  {
    ucvector compressed_data;
    ucvector_init(&compressed_data);
    error = zlib_compress(&compressed_data.data, &compressed_data.size,
                          (unsigned char*)textstring, textsize, zlibsettings);
    if(!error)
    {
      for(i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
    }
    ucvector_cleanup(&compressed_data);
  }
  else /*not compressed*/
  {
    for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
  }

  if(!error) error = addChunk(out, "iTXt", data.data, data.size);
  ucvector_cleanup(&data);
  return error;
}